

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

void __thiscall
google::protobuf::Reflection::SetField<bool>
          (Reflection *this,Message *message,FieldDescriptor *field,bool *value)

{
  bool bVar1;
  uint32 uVar2;
  
  if (*(long *)(field + 0x58) != 0) {
    bVar1 = HasOneofField(this,message,field);
    if (!bVar1) {
      ClearOneof(this,message,*(OneofDescriptor **)(field + 0x58));
    }
  }
  bVar1 = *value;
  uVar2 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
  *(bool *)((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar2) = bVar1;
  if (*(long *)(field + 0x58) != 0) {
    SetOneofCase(this,message,field);
    return;
  }
  SetBit(this,message,field);
  return;
}

Assistant:

void Reflection::SetField(Message* message, const FieldDescriptor* field,
                          const Type& value) const {
  if (field->containing_oneof() && !HasOneofField(*message, field)) {
    ClearOneof(message, field->containing_oneof());
  }
  *MutableRaw<Type>(message, field) = value;
  field->containing_oneof() ? SetOneofCase(message, field)
                            : SetBit(message, field);
}